

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorUtilTest.cpp
# Opt level: O1

void __thiscall jaegertracing::utils::ErrorUtil_test_Test::TestBody(ErrorUtil_test_Test *this)

{
  error_category *__ecat;
  runtime_error *this_00;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Exception transportEx;
  TestLogger logger;
  runtime_error stdEx;
  system_error sysEx;
  ostringstream oss;
  undefined1 *local_260 [2];
  undefined1 local_250 [20];
  undefined4 local_23c;
  undefined **local_218 [2];
  undefined4 local_208;
  undefined **local_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  runtime_error local_1d8 [16];
  system_error local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1f8 = local_1e8;
  local_200 = &PTR__TestLogger_00211680;
  local_1f0 = 0;
  local_1e8[0] = 0;
  std::runtime_error::runtime_error(local_1d8,"runtime error");
  __ecat = (error_category *)std::_V2::generic_category();
  std::system_error::system_error(local_1c8,-1,__ecat);
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"test","");
  std::runtime_error::runtime_error((runtime_error *)local_218,(string *)local_260);
  local_218[0] = &PTR__runtime_error_00211718;
  local_208 = 5;
  if (local_260[0] != local_250) {
    operator_delete(local_260[0]);
  }
  local_23c = 0;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_1d8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(ErrorUtil, test)
{
    std::ostringstream oss;
    TestLogger logger;
    std::runtime_error stdEx("runtime error");
    std::system_error sysEx(-1, std::generic_category());
    Sender::Exception transportEx("test", 5);
    for (auto i = 0; i < 4; ++i) {
        try {
            switch (i) {
            case 0:
                throw stdEx;
            case 1:
                throw sysEx;
            case 2:
                throw transportEx;
            default:
                ASSERT_EQ(3, i);
                throw 5;
            }
        } catch (...) {
            ErrorUtil::logError(logger, "test");
            switch (i) {
            case 0: {
                ASSERT_EQ("test: runtime error", logger.str());
            } break;
            case 1: {
                ASSERT_TRUE(endsWith(logger.str(), ", code=-1"));
            } break;
            case 2: {
                ASSERT_EQ("test: test, numFailed=5", logger.str());
            } break;
            default: {
                ASSERT_EQ(3, i);
                ASSERT_EQ("test", logger.str());
            } break;
            }
        }
    }
}